

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall
duckdb_re2::Compiler::UncachedRuneByteSuffix
          (Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  Inst *inst0;
  PatchList PVar1;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  Frag FVar2;
  
  FVar2 = ByteRange(this,(int)CONCAT71(in_register_00000031,lo),
                    (int)CONCAT71(in_register_00000011,hi),foldcase);
  inst0 = (this->inst_).ptr_._M_t.
          super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
          .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if (next == 0) {
    PVar1 = PatchList::Append(inst0,(this->rune_range_).end,FVar2.end);
    (this->rune_range_).end = PVar1;
  }
  else {
    PatchList::Patch(inst0,FVar2.end,next);
  }
  return FVar2.begin;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_.data(), f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_.data(), rune_range_.end, f.end);
  }
  return f.begin;
}